

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adplanner.cpp
# Opt level: O2

int __thiscall ADPlanner::set_goal(ADPlanner *this,int goal_stateID)

{
  DiscreteSpaceInformation *pDVar1;
  _func_int **pp_Var2;
  int iVar3;
  undefined4 in_register_00000034;
  
  pDVar1 = (this->super_SBPLPlanner).environment_;
  (*pDVar1->_vptr_DiscreteSpaceInformation[0x12])
            (pDVar1,CONCAT44(in_register_00000034,goal_stateID),1,_stdout);
  pp_Var2 = (this->super_SBPLPlanner)._vptr_SBPLPlanner;
  if (this->bforwardsearch == true) {
    iVar3 = (*pp_Var2[0x2e])(this,goal_stateID);
  }
  else {
    iVar3 = (*pp_Var2[0x2f])(this,goal_stateID,this->pSearchStateSpace_);
  }
  return (uint)(iVar3 == 1);
}

Assistant:

int ADPlanner::set_goal(int goal_stateID)
{
    SBPL_PRINTF("planner: setting goal to %d\n", goal_stateID);
    environment_->PrintState(goal_stateID, true, stdout);

    if (bforwardsearch) {
        if (SetSearchGoalState(goal_stateID, pSearchStateSpace_) != 1) {
            SBPL_ERROR("ERROR: failed to set search goal state\n");
            return 0;
        }
    }
    else {
        if (SetSearchStartState(goal_stateID, pSearchStateSpace_) != 1) {
            SBPL_ERROR("ERROR: failed to set search start state\n");
            return 0;
        }
    }

    return 1;
}